

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdump.h
# Opt level: O2

void hexdump(char *desc,void *addr,size_t len,FILE *fp)

{
  uchar uVar1;
  byte bVar2;
  ulong uVar3;
  uchar buf [17];
  
  if (desc != (char *)0x0) {
    fprintf((FILE *)fp,"%s:\n",desc);
  }
  bVar2 = -(char)len;
  for (uVar3 = 0; (len & 0xffffffff) != uVar3; uVar3 = uVar3 + 1) {
    if ((uVar3 & 0xf) == 0) {
      if (uVar3 != 0) {
        fprintf((FILE *)fp,"  |%s|\n",buf);
      }
      fprintf((FILE *)fp,"%08x ",uVar3 & 0xffffffff);
    }
    else if ((uVar3 & 7) == 0) {
      fputc(0x20,(FILE *)fp);
    }
    fprintf((FILE *)fp," %02x",(ulong)*(byte *)((long)addr + uVar3));
    uVar1 = *(uchar *)((long)addr + uVar3);
    if ((byte)(uVar1 + 0x81) < 0xa1) {
      uVar1 = '.';
    }
    buf[(uint)uVar3 & 0xf] = uVar1;
    buf[(uVar3 & 0xf) + 1] = '\0';
    bVar2 = bVar2 + 1;
  }
  if (0xfffffff7 < ((uint)len & 0xf) - 9) {
    fputc(0x20,(FILE *)fp);
  }
  for (; (bVar2 & 0xf) != ((byte)len & 0xf); len = (size_t)((int)len + 1)) {
    fwrite("   ",3,1,(FILE *)fp);
  }
  fprintf((FILE *)fp,"  |%s|\n",buf);
  return;
}

Assistant:

static void hexdump(const char *desc, const void *addr, size_t len, FILE *fp) {
    unsigned int i;
    unsigned char buf[17];
    const unsigned char *pc = (const unsigned char*)addr;

    /* Output description if given. */
    if (desc != NULL) fprintf(fp, "%s:\n", desc);

    for (i = 0; i < (unsigned int)len; i++) {

        if ((i % 16) == 0) {
            if (i != 0) fprintf(fp, "  |%s|\n", buf);
            fprintf(fp, "%08x ", i);
        } else if ((i % 8) == 0) {
            fprintf(fp, " ");
        }
        fprintf(fp, " %02x", pc[i]);
        if ((pc[i] < 0x20) || (pc[i] > 0x7e)) {
            buf[i % 16] = '.';
        } else {
            buf[i % 16] = pc[i];
        }
        buf[(i % 16) + 1] = '\0';
    }
    if (i % 16 <= 8 && i % 16 != 0) fprintf(fp, " ");
    while ((i % 16) != 0) {
        fprintf(fp, "   ");
        i++;
    }
    fprintf(fp, "  |%s|\n", buf);
}